

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O1

int notify_no_fd_interrupt(int epfd,epoll_event *events,int maxevents,int timeout)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  
  uVar1 = epoll_wait_fake.call_count;
  piVar2 = __errno_location();
  iVar3 = 0x16;
  if (uVar1 == 1) {
    iVar3 = 4;
  }
  *piVar2 = iVar3;
  return -1;
}

Assistant:

static int notify_no_fd_interrupt(int epfd, struct epoll_event *events,
                                  int maxevents, int timeout)
{
	(void)epfd;
	(void)maxevents;
	(void)timeout;
	(void)events;

	if (epoll_wait_fake.call_count == 1) {
		errno = EINTR;
		return -1;
	} else {
		errno = EINVAL;
		return -1;
	}
}